

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32_tests.cpp
# Opt level: O2

void __thiscall bech32_tests::bech32_testvectors_valid::test_method(bech32_testvectors_valid *this)

{
  string *str;
  long lVar1;
  int iVar2;
  check_type cVar5;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string file;
  const_string file_00;
  const_string file_01;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  assertion_result local_128;
  char **local_110;
  assertion_result local_108;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  allocator<char> local_9a;
  allocator<char> local_99;
  string recode;
  DecodeResult dec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (test_method()::CASES_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&test_method()::CASES_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)test_method()::CASES_abi_cxx11_,"A12UEL5L",(allocator<char> *)&dec);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(test_method()::CASES_abi_cxx11_ + 1),"a12uel5l",
                 (allocator<char> *)&recode);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(test_method()::CASES_abi_cxx11_ + 2),
                 "an83characterlonghumanreadablepartthatcontainsthenumber1andtheexcludedcharactersbio1tt5tgs"
                 ,(allocator<char> *)&local_128);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(test_method()::CASES_abi_cxx11_ + 3),
                 "abcdef1qpzry9x8gf2tvdw0s3jn54khce6mua7lmqqqxw",(allocator<char> *)&local_108);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(test_method()::CASES_abi_cxx11_ + 4),
                 "11qqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqc8247j"
                 ,(allocator<char> *)&local_138);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(test_method()::CASES_abi_cxx11_ + 5),
                 "split1checkupstagehandshakeupstreamerranterredcaperred2y9e3w",&local_99);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(test_method()::CASES_abi_cxx11_ + 6),"?1ezyfcl",&local_9a);
      __cxa_atexit(::__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&test_method()::CASES_abi_cxx11_);
    }
  }
  for (_cVar5 = CHECK_PRED; _cVar5 != 0xe0; _cVar5 = (check_type)((long)_cVar5 + 0x20)) {
    str = (string *)((long)&test_method()::CASES_abi_cxx11_[0]._M_dataplus._M_p + (long)_cVar5);
    bech32::Decode(&dec,str,BECH32);
    local_b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bech32_tests.cpp"
    ;
    local_a8 = "";
    local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x1c;
    file.m_begin = (iterator)&local_b0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_c0,msg);
    local_128.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(dec.encoding == BECH32);
    local_128.m_message.px = (element_type *)0x0;
    local_128.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_108._0_8_ = "dec.encoding == bech32::Encoding::BECH32";
    local_108.m_message.px = (element_type *)0xb58df0;
    recode._M_string_length._0_1_ = 0;
    recode._M_dataplus._M_p = "<W\x1b";
    recode.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    recode.field_2._8_8_ = &local_108;
    local_d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bech32_tests.cpp"
    ;
    local_c8 = "";
    pvVar3 = &DAT_00000001;
    pvVar4 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_128,(lazy_ostream *)&recode,1,0,WARN,_cVar5,(size_t)&local_d0,0x1c);
    boost::detail::shared_count::~shared_count(&local_128.m_message.pn);
    bech32::Encode(&recode,BECH32,&dec.hrp,&dec.data);
    local_e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bech32_tests.cpp"
    ;
    local_d8 = "";
    local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = pvVar4;
    msg_00.m_begin = pvVar3;
    file_00.m_end = (iterator)0x1e;
    file_00.m_begin = (iterator)&local_e0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_f0,
               msg_00);
    local_108.m_message.px = (element_type *)0x0;
    local_108.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_138 = "!recode.empty()";
    local_130 = "";
    local_128.m_message.px = (element_type *)((ulong)local_128.m_message.px & 0xffffffffffffff00);
    local_128._0_8_ = &PTR__lazy_ostream_0113a070;
    local_128.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_110 = &local_138;
    local_148 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bech32_tests.cpp"
    ;
    local_140 = "";
    pvVar3 = &DAT_00000001;
    pvVar4 = (iterator)0x0;
    local_108.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         (CONCAT71(recode._M_string_length._1_7_,(undefined1)recode._M_string_length) != 0);
    boost::test_tools::tt_detail::report_assertion
              (&local_108,(lazy_ostream *)&local_128,1,0,WARN,_cVar5,(size_t)&local_148,0x1e);
    boost::detail::shared_count::~shared_count(&local_108.m_message.pn);
    local_158 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bech32_tests.cpp"
    ;
    local_150 = "";
    local_168 = &boost::unit_test::basic_cstring<char_const>::null;
    local_160 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_01.m_end = pvVar4;
    msg_01.m_begin = pvVar3;
    file_01.m_end = (iterator)0x1f;
    file_01.m_begin = (iterator)&local_158;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_168,
               msg_01);
    local_108.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)CaseInsensitiveEqual(str,&recode);
    local_108.m_message.px = (element_type *)0x0;
    local_108.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_138 = "CaseInsensitiveEqual(str, recode)";
    local_130 = "";
    local_128.m_message.px = (element_type *)((ulong)local_128.m_message.px & 0xffffffffffffff00);
    local_128._0_8_ = &PTR__lazy_ostream_0113a070;
    local_128.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_110 = &local_138;
    local_178 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bech32_tests.cpp"
    ;
    local_170 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_108,(lazy_ostream *)&local_128,1,0,WARN,_cVar5,(size_t)&local_178,0x1f);
    boost::detail::shared_count::~shared_count(&local_108.m_message.pn);
    std::__cxx11::string::~string((string *)&recode);
    bech32::DecodeResult::~DecodeResult(&dec);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(bech32_testvectors_valid)
{
    static const std::string CASES[] = {
        "A12UEL5L",
        "a12uel5l",
        "an83characterlonghumanreadablepartthatcontainsthenumber1andtheexcludedcharactersbio1tt5tgs",
        "abcdef1qpzry9x8gf2tvdw0s3jn54khce6mua7lmqqqxw",
        "11qqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqc8247j",
        "split1checkupstagehandshakeupstreamerranterredcaperred2y9e3w",
        "?1ezyfcl",
    };
    for (const std::string& str : CASES) {
        const auto dec = bech32::Decode(str);
        BOOST_CHECK(dec.encoding == bech32::Encoding::BECH32);
        std::string recode = bech32::Encode(bech32::Encoding::BECH32, dec.hrp, dec.data);
        BOOST_CHECK(!recode.empty());
        BOOST_CHECK(CaseInsensitiveEqual(str, recode));
    }
}